

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O0

void __thiscall
rr::FragmentProcessor::executeBlendFactorComputeRGB
          (FragmentProcessor *this,Vec4 *blendColor,BlendState *blendRGBState)

{
  float fVar1;
  float fVar2;
  Vector<float,_3> local_6d4;
  Vec4 *local_6c8;
  Vec4 *dst_37;
  Vec4 *src1_37;
  Vec4 *src_37;
  int regSampleNdx_37;
  float local_6a4;
  Vec4 *local_6a0;
  Vec4 *dst_36;
  Vec4 *src1_36;
  Vec4 *src_36;
  int regSampleNdx_36;
  Vector<float,_3> local_678;
  undefined8 local_66c;
  float local_664;
  Vec4 *local_660;
  Vec4 *dst_35;
  Vec4 *src1_35;
  Vec4 *src_35;
  int regSampleNdx_35;
  float local_63c;
  Vec4 *local_638;
  Vec4 *dst_34;
  Vec4 *src1_34;
  Vec4 *src_34;
  int regSampleNdx_34;
  float local_614;
  Vec4 *local_610;
  Vec4 *dst_33;
  Vec4 *src1_33;
  Vec4 *src_33;
  int regSampleNdx_33;
  float local_5ec;
  Vec4 *local_5e8;
  Vec4 *dst_32;
  Vec4 *src1_32;
  Vec4 *src_32;
  int regSampleNdx_32;
  float local_5c4;
  Vec4 *local_5c0;
  Vec4 *dst_31;
  Vec4 *src1_31;
  Vec4 *src_31;
  int regSampleNdx_31;
  Vector<float,_3> local_598;
  undefined8 local_58c;
  float local_584;
  Vec4 *local_580;
  Vec4 *dst_30;
  Vec4 *src1_30;
  Vec4 *src_30;
  int regSampleNdx_30;
  float local_55c;
  Vec4 *local_558;
  Vec4 *dst_29;
  Vec4 *src1_29;
  Vec4 *src_29;
  int regSampleNdx_29;
  float local_534;
  Vec4 *local_530;
  Vec4 *dst_28;
  Vec4 *src1_28;
  Vec4 *src_28;
  int regSampleNdx_28;
  float local_50c;
  Vec4 *local_508;
  Vec4 *dst_27;
  Vec4 *src1_27;
  Vec4 *src_27;
  int regSampleNdx_27;
  float local_4e4;
  Vec4 *local_4e0;
  Vec4 *dst_26;
  Vec4 *src1_26;
  Vec4 *src_26;
  int regSampleNdx_26;
  float local_4bc;
  Vec4 *local_4b8;
  Vec4 *dst_25;
  Vec4 *src1_25;
  Vec4 *src_25;
  int regSampleNdx_25;
  Vector<float,_3> local_490;
  undefined8 local_484;
  float local_47c;
  Vec4 *local_478;
  Vec4 *dst_24;
  Vec4 *src1_24;
  Vec4 *src_24;
  int regSampleNdx_24;
  float local_454;
  Vec4 *local_450;
  Vec4 *dst_23;
  Vec4 *src1_23;
  Vec4 *src_23;
  int regSampleNdx_23;
  Vector<float,_3> local_428;
  undefined8 local_41c;
  float local_414;
  Vec4 *local_410;
  Vec4 *dst_22;
  Vec4 *src1_22;
  Vec4 *src_22;
  int regSampleNdx_22;
  float local_3ec;
  Vec4 *local_3e8;
  Vec4 *dst_21;
  Vec4 *src1_21;
  Vec4 *src_21;
  int regSampleNdx_21;
  float local_3c4;
  Vec4 *local_3c0;
  Vec4 *dst_20;
  Vec4 *src1_20;
  Vec4 *src_20;
  int regSampleNdx_20;
  float local_39c;
  Vec4 *local_398;
  Vec4 *dst_19;
  Vec4 *src1_19;
  Vec4 *src_19;
  int regSampleNdx_19;
  float local_374;
  Vec4 *local_370;
  Vec4 *dst_18;
  Vec4 *src1_18;
  Vec4 *src_18;
  int regSampleNdx_18;
  float local_34c;
  Vec4 *local_348;
  Vec4 *dst_17;
  Vec4 *src1_17;
  Vec4 *src_17;
  int regSampleNdx_17;
  Vector<float,_3> local_320;
  undefined8 local_314;
  float local_30c;
  Vec4 *local_308;
  Vec4 *dst_16;
  Vec4 *src1_16;
  Vec4 *src_16;
  int regSampleNdx_16;
  float local_2e4;
  Vec4 *local_2e0;
  Vec4 *dst_15;
  Vec4 *src1_15;
  Vec4 *src_15;
  int regSampleNdx_15;
  float local_2bc;
  Vec4 *local_2b8;
  Vec4 *dst_14;
  Vec4 *src1_14;
  Vec4 *src_14;
  int regSampleNdx_14;
  float local_294;
  Vec4 *local_290;
  Vec4 *dst_13;
  Vec4 *src1_13;
  Vec4 *src_13;
  int regSampleNdx_13;
  float local_26c;
  Vec4 *local_268;
  Vec4 *dst_12;
  Vec4 *src1_12;
  Vec4 *src_12;
  int regSampleNdx_12;
  Vector<float,_3> local_240;
  undefined8 local_234;
  float local_22c;
  Vec4 *local_228;
  Vec4 *dst_11;
  Vec4 *src1_11;
  Vec4 *src_11;
  int regSampleNdx_11;
  float local_204;
  Vec4 *local_200;
  Vec4 *dst_10;
  Vec4 *src1_10;
  Vec4 *src_10;
  int regSampleNdx_10;
  float local_1dc;
  Vec4 *local_1d8;
  Vec4 *dst_9;
  Vec4 *src1_9;
  Vec4 *src_9;
  int regSampleNdx_9;
  float local_1b4;
  Vec4 *local_1b0;
  Vec4 *dst_8;
  Vec4 *src1_8;
  Vec4 *src_8;
  int regSampleNdx_8;
  float local_18c;
  Vec4 *local_188;
  Vec4 *dst_7;
  Vec4 *src1_7;
  Vec4 *src_7;
  int regSampleNdx_7;
  float local_164;
  Vec4 *local_160;
  Vec4 *dst_6;
  Vec4 *src1_6;
  Vec4 *src_6;
  int regSampleNdx_6;
  Vector<float,_3> local_138;
  undefined8 local_12c;
  float local_124;
  Vec4 *local_120;
  Vec4 *dst_5;
  Vec4 *src1_5;
  Vec4 *src_5;
  int regSampleNdx_5;
  float local_fc;
  Vec4 *local_f8;
  Vec4 *dst_4;
  Vec4 *src1_4;
  Vec4 *src_4;
  int regSampleNdx_4;
  Vector<float,_3> local_d0;
  undefined8 local_c4;
  float local_bc;
  Vec4 *local_b8;
  Vec4 *dst_3;
  Vec4 *src1_3;
  Vec4 *src_3;
  int regSampleNdx_3;
  float local_94;
  Vec4 *local_90;
  Vec4 *dst_2;
  Vec4 *src1_2;
  Vec4 *src_2;
  int regSampleNdx_2;
  float local_6c;
  Vec4 *local_68;
  Vec4 *dst_1;
  Vec4 *src1_1;
  Vec4 *src_1;
  int regSampleNdx_1;
  float local_44;
  Vec4 *local_40;
  Vec4 *dst;
  Vec4 *src1;
  Vec4 *src;
  BlendState *pBStack_20;
  int regSampleNdx;
  BlendState *blendRGBState_local;
  Vec4 *blendColor_local;
  FragmentProcessor *this_local;
  
  pBStack_20 = blendRGBState;
  blendRGBState_local = (BlendState *)blendColor;
  blendColor_local = (Vec4 *)this;
  switch(blendRGBState->srcFunc) {
  case BLENDFUNC_ZERO:
    for (src._4_4_ = 0; src._4_4_ < 0x40; src._4_4_ = src._4_4_ + 1) {
      if ((this->m_sampleRegister[src._4_4_].isAlive & 1U) != 0) {
        src1 = &this->m_sampleRegister[src._4_4_].clampedBlendSrcColor;
        dst = &this->m_sampleRegister[src._4_4_].clampedBlendSrc1Color;
        local_40 = &this->m_sampleRegister[src._4_4_].clampedBlendDstColor;
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)((long)&src_1 + 4),0.0);
        *(undefined8 *)this->m_sampleRegister[src._4_4_].blendSrcFactorRGB.m_data =
             stack0xffffffffffffffb4;
        this->m_sampleRegister[src._4_4_].blendSrcFactorRGB.m_data[2] = local_44;
      }
    }
    break;
  case BLENDFUNC_ONE:
    for (src_1._0_4_ = 0; (int)src_1 < 0x40; src_1._0_4_ = (int)src_1 + 1) {
      if ((this->m_sampleRegister[(int)src_1].isAlive & 1U) != 0) {
        src1_1 = &this->m_sampleRegister[(int)src_1].clampedBlendSrcColor;
        dst_1 = &this->m_sampleRegister[(int)src_1].clampedBlendSrc1Color;
        local_68 = &this->m_sampleRegister[(int)src_1].clampedBlendDstColor;
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)((long)&src_2 + 4),1.0);
        *(undefined8 *)this->m_sampleRegister[(int)src_1].blendSrcFactorRGB.m_data =
             stack0xffffffffffffff8c;
        this->m_sampleRegister[(int)src_1].blendSrcFactorRGB.m_data[2] = local_6c;
      }
    }
    break;
  case BLENDFUNC_SRC_COLOR:
    for (src_2._0_4_ = 0; (int)src_2 < 0x40; src_2._0_4_ = (int)src_2 + 1) {
      if ((this->m_sampleRegister[(int)src_2].isAlive & 1U) != 0) {
        src1_2 = &this->m_sampleRegister[(int)src_2].clampedBlendSrcColor;
        dst_2 = &this->m_sampleRegister[(int)src_2].clampedBlendSrc1Color;
        local_90 = &this->m_sampleRegister[(int)src_2].clampedBlendDstColor;
        tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)((long)&src_3 + 4),(int)src1_2,0,1);
        *(undefined8 *)this->m_sampleRegister[(int)src_2].blendSrcFactorRGB.m_data =
             stack0xffffffffffffff64;
        this->m_sampleRegister[(int)src_2].blendSrcFactorRGB.m_data[2] = local_94;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_SRC_COLOR:
    for (src_3._0_4_ = 0; (int)src_3 < 0x40; src_3._0_4_ = (int)src_3 + 1) {
      if ((this->m_sampleRegister[(int)src_3].isAlive & 1U) != 0) {
        src1_3 = &this->m_sampleRegister[(int)src_3].clampedBlendSrcColor;
        dst_3 = &this->m_sampleRegister[(int)src_3].clampedBlendSrc1Color;
        local_b8 = &this->m_sampleRegister[(int)src_3].clampedBlendDstColor;
        tcu::Vector<float,_3>::Vector(&local_d0,1.0);
        tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)((long)&src_4 + 4),(int)src1_3,0,1);
        tcu::operator-((tcu *)&local_c4,&local_d0,(Vector<float,_3> *)((long)&src_4 + 4));
        *(undefined8 *)this->m_sampleRegister[(int)src_3].blendSrcFactorRGB.m_data = local_c4;
        this->m_sampleRegister[(int)src_3].blendSrcFactorRGB.m_data[2] = local_bc;
      }
    }
    break;
  case BLENDFUNC_DST_COLOR:
    for (src_4._0_4_ = 0; (int)src_4 < 0x40; src_4._0_4_ = (int)src_4 + 1) {
      if ((this->m_sampleRegister[(int)src_4].isAlive & 1U) != 0) {
        src1_4 = &this->m_sampleRegister[(int)src_4].clampedBlendSrcColor;
        dst_4 = &this->m_sampleRegister[(int)src_4].clampedBlendSrc1Color;
        local_f8 = &this->m_sampleRegister[(int)src_4].clampedBlendDstColor;
        tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)((long)&src_5 + 4),(int)local_f8,0,1);
        *(undefined8 *)this->m_sampleRegister[(int)src_4].blendSrcFactorRGB.m_data =
             stack0xfffffffffffffefc;
        this->m_sampleRegister[(int)src_4].blendSrcFactorRGB.m_data[2] = local_fc;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_DST_COLOR:
    for (src_5._0_4_ = 0; (int)src_5 < 0x40; src_5._0_4_ = (int)src_5 + 1) {
      if ((this->m_sampleRegister[(int)src_5].isAlive & 1U) != 0) {
        src1_5 = &this->m_sampleRegister[(int)src_5].clampedBlendSrcColor;
        dst_5 = &this->m_sampleRegister[(int)src_5].clampedBlendSrc1Color;
        local_120 = &this->m_sampleRegister[(int)src_5].clampedBlendDstColor;
        tcu::Vector<float,_3>::Vector(&local_138,1.0);
        tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)((long)&src_6 + 4),(int)local_120,0,1);
        tcu::operator-((tcu *)&local_12c,&local_138,(Vector<float,_3> *)((long)&src_6 + 4));
        *(undefined8 *)this->m_sampleRegister[(int)src_5].blendSrcFactorRGB.m_data = local_12c;
        this->m_sampleRegister[(int)src_5].blendSrcFactorRGB.m_data[2] = local_124;
      }
    }
    break;
  case BLENDFUNC_SRC_ALPHA:
    for (src_6._0_4_ = 0; (int)src_6 < 0x40; src_6._0_4_ = (int)src_6 + 1) {
      if ((this->m_sampleRegister[(int)src_6].isAlive & 1U) != 0) {
        src1_6 = &this->m_sampleRegister[(int)src_6].clampedBlendSrcColor;
        dst_6 = &this->m_sampleRegister[(int)src_6].clampedBlendSrc1Color;
        local_160 = &this->m_sampleRegister[(int)src_6].clampedBlendDstColor;
        fVar2 = tcu::Vector<float,_4>::w(src1_6);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)((long)&src_7 + 4),fVar2);
        *(undefined8 *)this->m_sampleRegister[(int)src_6].blendSrcFactorRGB.m_data =
             stack0xfffffffffffffe94;
        this->m_sampleRegister[(int)src_6].blendSrcFactorRGB.m_data[2] = local_164;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_SRC_ALPHA:
    for (src_7._0_4_ = 0; (int)src_7 < 0x40; src_7._0_4_ = (int)src_7 + 1) {
      if ((this->m_sampleRegister[(int)src_7].isAlive & 1U) != 0) {
        src1_7 = &this->m_sampleRegister[(int)src_7].clampedBlendSrcColor;
        dst_7 = &this->m_sampleRegister[(int)src_7].clampedBlendSrc1Color;
        local_188 = &this->m_sampleRegister[(int)src_7].clampedBlendDstColor;
        fVar2 = tcu::Vector<float,_4>::w(src1_7);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)((long)&src_8 + 4),1.0 - fVar2);
        *(undefined8 *)this->m_sampleRegister[(int)src_7].blendSrcFactorRGB.m_data =
             stack0xfffffffffffffe6c;
        this->m_sampleRegister[(int)src_7].blendSrcFactorRGB.m_data[2] = local_18c;
      }
    }
    break;
  case BLENDFUNC_DST_ALPHA:
    for (src_8._0_4_ = 0; (int)src_8 < 0x40; src_8._0_4_ = (int)src_8 + 1) {
      if ((this->m_sampleRegister[(int)src_8].isAlive & 1U) != 0) {
        src1_8 = &this->m_sampleRegister[(int)src_8].clampedBlendSrcColor;
        dst_8 = &this->m_sampleRegister[(int)src_8].clampedBlendSrc1Color;
        local_1b0 = &this->m_sampleRegister[(int)src_8].clampedBlendDstColor;
        fVar2 = tcu::Vector<float,_4>::w(local_1b0);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)((long)&src_9 + 4),fVar2);
        *(undefined8 *)this->m_sampleRegister[(int)src_8].blendSrcFactorRGB.m_data =
             stack0xfffffffffffffe44;
        this->m_sampleRegister[(int)src_8].blendSrcFactorRGB.m_data[2] = local_1b4;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_DST_ALPHA:
    for (src_9._0_4_ = 0; (int)src_9 < 0x40; src_9._0_4_ = (int)src_9 + 1) {
      if ((this->m_sampleRegister[(int)src_9].isAlive & 1U) != 0) {
        src1_9 = &this->m_sampleRegister[(int)src_9].clampedBlendSrcColor;
        dst_9 = &this->m_sampleRegister[(int)src_9].clampedBlendSrc1Color;
        local_1d8 = &this->m_sampleRegister[(int)src_9].clampedBlendDstColor;
        fVar2 = tcu::Vector<float,_4>::w(local_1d8);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)((long)&src_10 + 4),1.0 - fVar2);
        *(undefined8 *)this->m_sampleRegister[(int)src_9].blendSrcFactorRGB.m_data =
             stack0xfffffffffffffe1c;
        this->m_sampleRegister[(int)src_9].blendSrcFactorRGB.m_data[2] = local_1dc;
      }
    }
    break;
  case BLENDFUNC_CONSTANT_COLOR:
    for (src_10._0_4_ = 0; (int)src_10 < 0x40; src_10._0_4_ = (int)src_10 + 1) {
      if ((this->m_sampleRegister[(int)src_10].isAlive & 1U) != 0) {
        src1_10 = &this->m_sampleRegister[(int)src_10].clampedBlendSrcColor;
        dst_10 = &this->m_sampleRegister[(int)src_10].clampedBlendSrc1Color;
        local_200 = &this->m_sampleRegister[(int)src_10].clampedBlendDstColor;
        tcu::Vector<float,_4>::swizzle
                  ((Vector<float,_4> *)((long)&src_11 + 4),(int)blendRGBState_local,0,1);
        *(undefined8 *)this->m_sampleRegister[(int)src_10].blendSrcFactorRGB.m_data =
             stack0xfffffffffffffdf4;
        this->m_sampleRegister[(int)src_10].blendSrcFactorRGB.m_data[2] = local_204;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_CONSTANT_COLOR:
    for (src_11._0_4_ = 0; (int)src_11 < 0x40; src_11._0_4_ = (int)src_11 + 1) {
      if ((this->m_sampleRegister[(int)src_11].isAlive & 1U) != 0) {
        src1_11 = &this->m_sampleRegister[(int)src_11].clampedBlendSrcColor;
        dst_11 = &this->m_sampleRegister[(int)src_11].clampedBlendSrc1Color;
        local_228 = &this->m_sampleRegister[(int)src_11].clampedBlendDstColor;
        tcu::Vector<float,_3>::Vector(&local_240,1.0);
        tcu::Vector<float,_4>::swizzle
                  ((Vector<float,_4> *)((long)&src_12 + 4),(int)blendRGBState_local,0,1);
        tcu::operator-((tcu *)&local_234,&local_240,(Vector<float,_3> *)((long)&src_12 + 4));
        *(undefined8 *)this->m_sampleRegister[(int)src_11].blendSrcFactorRGB.m_data = local_234;
        this->m_sampleRegister[(int)src_11].blendSrcFactorRGB.m_data[2] = local_22c;
      }
    }
    break;
  case BLENDFUNC_CONSTANT_ALPHA:
    for (src_12._0_4_ = 0; (int)src_12 < 0x40; src_12._0_4_ = (int)src_12 + 1) {
      if ((this->m_sampleRegister[(int)src_12].isAlive & 1U) != 0) {
        src1_12 = &this->m_sampleRegister[(int)src_12].clampedBlendSrcColor;
        dst_12 = &this->m_sampleRegister[(int)src_12].clampedBlendSrc1Color;
        local_268 = &this->m_sampleRegister[(int)src_12].clampedBlendDstColor;
        fVar2 = tcu::Vector<float,_4>::w((Vector<float,_4> *)blendRGBState_local);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)((long)&src_13 + 4),fVar2);
        *(undefined8 *)this->m_sampleRegister[(int)src_12].blendSrcFactorRGB.m_data =
             stack0xfffffffffffffd8c;
        this->m_sampleRegister[(int)src_12].blendSrcFactorRGB.m_data[2] = local_26c;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_CONSTANT_ALPHA:
    for (src_13._0_4_ = 0; (int)src_13 < 0x40; src_13._0_4_ = (int)src_13 + 1) {
      if ((this->m_sampleRegister[(int)src_13].isAlive & 1U) != 0) {
        src1_13 = &this->m_sampleRegister[(int)src_13].clampedBlendSrcColor;
        dst_13 = &this->m_sampleRegister[(int)src_13].clampedBlendSrc1Color;
        local_290 = &this->m_sampleRegister[(int)src_13].clampedBlendDstColor;
        fVar2 = tcu::Vector<float,_4>::w((Vector<float,_4> *)blendRGBState_local);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)((long)&src_14 + 4),1.0 - fVar2);
        *(undefined8 *)this->m_sampleRegister[(int)src_13].blendSrcFactorRGB.m_data =
             stack0xfffffffffffffd64;
        this->m_sampleRegister[(int)src_13].blendSrcFactorRGB.m_data[2] = local_294;
      }
    }
    break;
  case BLENDFUNC_SRC_ALPHA_SATURATE:
    for (src_14._0_4_ = 0; (int)src_14 < 0x40; src_14._0_4_ = (int)src_14 + 1) {
      if ((this->m_sampleRegister[(int)src_14].isAlive & 1U) != 0) {
        src1_14 = &this->m_sampleRegister[(int)src_14].clampedBlendSrcColor;
        dst_14 = &this->m_sampleRegister[(int)src_14].clampedBlendSrc1Color;
        local_2b8 = &this->m_sampleRegister[(int)src_14].clampedBlendDstColor;
        fVar2 = tcu::Vector<float,_4>::w(src1_14);
        fVar1 = tcu::Vector<float,_4>::w(local_2b8);
        fVar2 = de::min<float>(fVar2,1.0 - fVar1);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)((long)&src_15 + 4),fVar2);
        *(undefined8 *)this->m_sampleRegister[(int)src_14].blendSrcFactorRGB.m_data =
             stack0xfffffffffffffd3c;
        this->m_sampleRegister[(int)src_14].blendSrcFactorRGB.m_data[2] = local_2bc;
      }
    }
    break;
  case BLENDFUNC_SRC1_COLOR:
    for (src_15._0_4_ = 0; (int)src_15 < 0x40; src_15._0_4_ = (int)src_15 + 1) {
      if ((this->m_sampleRegister[(int)src_15].isAlive & 1U) != 0) {
        src1_15 = &this->m_sampleRegister[(int)src_15].clampedBlendSrcColor;
        dst_15 = &this->m_sampleRegister[(int)src_15].clampedBlendSrc1Color;
        local_2e0 = &this->m_sampleRegister[(int)src_15].clampedBlendDstColor;
        tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)((long)&src_16 + 4),(int)dst_15,0,1);
        *(undefined8 *)this->m_sampleRegister[(int)src_15].blendSrcFactorRGB.m_data =
             stack0xfffffffffffffd14;
        this->m_sampleRegister[(int)src_15].blendSrcFactorRGB.m_data[2] = local_2e4;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_SRC1_COLOR:
    for (src_16._0_4_ = 0; (int)src_16 < 0x40; src_16._0_4_ = (int)src_16 + 1) {
      if ((this->m_sampleRegister[(int)src_16].isAlive & 1U) != 0) {
        src1_16 = &this->m_sampleRegister[(int)src_16].clampedBlendSrcColor;
        dst_16 = &this->m_sampleRegister[(int)src_16].clampedBlendSrc1Color;
        local_308 = &this->m_sampleRegister[(int)src_16].clampedBlendDstColor;
        tcu::Vector<float,_3>::Vector(&local_320,1.0);
        tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)((long)&src_17 + 4),(int)dst_16,0,1);
        tcu::operator-((tcu *)&local_314,&local_320,(Vector<float,_3> *)((long)&src_17 + 4));
        *(undefined8 *)this->m_sampleRegister[(int)src_16].blendSrcFactorRGB.m_data = local_314;
        this->m_sampleRegister[(int)src_16].blendSrcFactorRGB.m_data[2] = local_30c;
      }
    }
    break;
  case BLENDFUNC_SRC1_ALPHA:
    for (src_17._0_4_ = 0; (int)src_17 < 0x40; src_17._0_4_ = (int)src_17 + 1) {
      if ((this->m_sampleRegister[(int)src_17].isAlive & 1U) != 0) {
        src1_17 = &this->m_sampleRegister[(int)src_17].clampedBlendSrcColor;
        dst_17 = &this->m_sampleRegister[(int)src_17].clampedBlendSrc1Color;
        local_348 = &this->m_sampleRegister[(int)src_17].clampedBlendDstColor;
        fVar2 = tcu::Vector<float,_4>::w(dst_17);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)((long)&src_18 + 4),fVar2);
        *(undefined8 *)this->m_sampleRegister[(int)src_17].blendSrcFactorRGB.m_data =
             stack0xfffffffffffffcac;
        this->m_sampleRegister[(int)src_17].blendSrcFactorRGB.m_data[2] = local_34c;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_SRC1_ALPHA:
    for (src_18._0_4_ = 0; (int)src_18 < 0x40; src_18._0_4_ = (int)src_18 + 1) {
      if ((this->m_sampleRegister[(int)src_18].isAlive & 1U) != 0) {
        src1_18 = &this->m_sampleRegister[(int)src_18].clampedBlendSrcColor;
        dst_18 = &this->m_sampleRegister[(int)src_18].clampedBlendSrc1Color;
        local_370 = &this->m_sampleRegister[(int)src_18].clampedBlendDstColor;
        fVar2 = tcu::Vector<float,_4>::w(dst_18);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)((long)&src_19 + 4),1.0 - fVar2);
        *(undefined8 *)this->m_sampleRegister[(int)src_18].blendSrcFactorRGB.m_data =
             stack0xfffffffffffffc84;
        this->m_sampleRegister[(int)src_18].blendSrcFactorRGB.m_data[2] = local_374;
      }
    }
  }
  switch(pBStack_20->dstFunc) {
  case BLENDFUNC_ZERO:
    for (src_19._0_4_ = 0; (int)src_19 < 0x40; src_19._0_4_ = (int)src_19 + 1) {
      if ((this->m_sampleRegister[(int)src_19].isAlive & 1U) != 0) {
        src1_19 = &this->m_sampleRegister[(int)src_19].clampedBlendSrcColor;
        dst_19 = &this->m_sampleRegister[(int)src_19].clampedBlendSrc1Color;
        local_398 = &this->m_sampleRegister[(int)src_19].clampedBlendDstColor;
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)((long)&src_20 + 4),0.0);
        *(undefined8 *)this->m_sampleRegister[(int)src_19].blendDstFactorRGB.m_data =
             stack0xfffffffffffffc5c;
        this->m_sampleRegister[(int)src_19].blendDstFactorRGB.m_data[2] = local_39c;
      }
    }
    break;
  case BLENDFUNC_ONE:
    for (src_20._0_4_ = 0; (int)src_20 < 0x40; src_20._0_4_ = (int)src_20 + 1) {
      if ((this->m_sampleRegister[(int)src_20].isAlive & 1U) != 0) {
        src1_20 = &this->m_sampleRegister[(int)src_20].clampedBlendSrcColor;
        dst_20 = &this->m_sampleRegister[(int)src_20].clampedBlendSrc1Color;
        local_3c0 = &this->m_sampleRegister[(int)src_20].clampedBlendDstColor;
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)((long)&src_21 + 4),1.0);
        *(undefined8 *)this->m_sampleRegister[(int)src_20].blendDstFactorRGB.m_data =
             stack0xfffffffffffffc34;
        this->m_sampleRegister[(int)src_20].blendDstFactorRGB.m_data[2] = local_3c4;
      }
    }
    break;
  case BLENDFUNC_SRC_COLOR:
    for (src_21._0_4_ = 0; (int)src_21 < 0x40; src_21._0_4_ = (int)src_21 + 1) {
      if ((this->m_sampleRegister[(int)src_21].isAlive & 1U) != 0) {
        src1_21 = &this->m_sampleRegister[(int)src_21].clampedBlendSrcColor;
        dst_21 = &this->m_sampleRegister[(int)src_21].clampedBlendSrc1Color;
        local_3e8 = &this->m_sampleRegister[(int)src_21].clampedBlendDstColor;
        tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)((long)&src_22 + 4),(int)src1_21,0,1);
        *(undefined8 *)this->m_sampleRegister[(int)src_21].blendDstFactorRGB.m_data =
             stack0xfffffffffffffc0c;
        this->m_sampleRegister[(int)src_21].blendDstFactorRGB.m_data[2] = local_3ec;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_SRC_COLOR:
    for (src_22._0_4_ = 0; (int)src_22 < 0x40; src_22._0_4_ = (int)src_22 + 1) {
      if ((this->m_sampleRegister[(int)src_22].isAlive & 1U) != 0) {
        src1_22 = &this->m_sampleRegister[(int)src_22].clampedBlendSrcColor;
        dst_22 = &this->m_sampleRegister[(int)src_22].clampedBlendSrc1Color;
        local_410 = &this->m_sampleRegister[(int)src_22].clampedBlendDstColor;
        tcu::Vector<float,_3>::Vector(&local_428,1.0);
        tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)((long)&src_23 + 4),(int)src1_22,0,1);
        tcu::operator-((tcu *)&local_41c,&local_428,(Vector<float,_3> *)((long)&src_23 + 4));
        *(undefined8 *)this->m_sampleRegister[(int)src_22].blendDstFactorRGB.m_data = local_41c;
        this->m_sampleRegister[(int)src_22].blendDstFactorRGB.m_data[2] = local_414;
      }
    }
    break;
  case BLENDFUNC_DST_COLOR:
    for (src_23._0_4_ = 0; (int)src_23 < 0x40; src_23._0_4_ = (int)src_23 + 1) {
      if ((this->m_sampleRegister[(int)src_23].isAlive & 1U) != 0) {
        src1_23 = &this->m_sampleRegister[(int)src_23].clampedBlendSrcColor;
        dst_23 = &this->m_sampleRegister[(int)src_23].clampedBlendSrc1Color;
        local_450 = &this->m_sampleRegister[(int)src_23].clampedBlendDstColor;
        tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)((long)&src_24 + 4),(int)local_450,0,1);
        *(undefined8 *)this->m_sampleRegister[(int)src_23].blendDstFactorRGB.m_data =
             stack0xfffffffffffffba4;
        this->m_sampleRegister[(int)src_23].blendDstFactorRGB.m_data[2] = local_454;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_DST_COLOR:
    for (src_24._0_4_ = 0; (int)src_24 < 0x40; src_24._0_4_ = (int)src_24 + 1) {
      if ((this->m_sampleRegister[(int)src_24].isAlive & 1U) != 0) {
        src1_24 = &this->m_sampleRegister[(int)src_24].clampedBlendSrcColor;
        dst_24 = &this->m_sampleRegister[(int)src_24].clampedBlendSrc1Color;
        local_478 = &this->m_sampleRegister[(int)src_24].clampedBlendDstColor;
        tcu::Vector<float,_3>::Vector(&local_490,1.0);
        tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)((long)&src_25 + 4),(int)local_478,0,1);
        tcu::operator-((tcu *)&local_484,&local_490,(Vector<float,_3> *)((long)&src_25 + 4));
        *(undefined8 *)this->m_sampleRegister[(int)src_24].blendDstFactorRGB.m_data = local_484;
        this->m_sampleRegister[(int)src_24].blendDstFactorRGB.m_data[2] = local_47c;
      }
    }
    break;
  case BLENDFUNC_SRC_ALPHA:
    for (src_25._0_4_ = 0; (int)src_25 < 0x40; src_25._0_4_ = (int)src_25 + 1) {
      if ((this->m_sampleRegister[(int)src_25].isAlive & 1U) != 0) {
        src1_25 = &this->m_sampleRegister[(int)src_25].clampedBlendSrcColor;
        dst_25 = &this->m_sampleRegister[(int)src_25].clampedBlendSrc1Color;
        local_4b8 = &this->m_sampleRegister[(int)src_25].clampedBlendDstColor;
        fVar2 = tcu::Vector<float,_4>::w(src1_25);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)((long)&src_26 + 4),fVar2);
        *(undefined8 *)this->m_sampleRegister[(int)src_25].blendDstFactorRGB.m_data =
             stack0xfffffffffffffb3c;
        this->m_sampleRegister[(int)src_25].blendDstFactorRGB.m_data[2] = local_4bc;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_SRC_ALPHA:
    for (src_26._0_4_ = 0; (int)src_26 < 0x40; src_26._0_4_ = (int)src_26 + 1) {
      if ((this->m_sampleRegister[(int)src_26].isAlive & 1U) != 0) {
        src1_26 = &this->m_sampleRegister[(int)src_26].clampedBlendSrcColor;
        dst_26 = &this->m_sampleRegister[(int)src_26].clampedBlendSrc1Color;
        local_4e0 = &this->m_sampleRegister[(int)src_26].clampedBlendDstColor;
        fVar2 = tcu::Vector<float,_4>::w(src1_26);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)((long)&src_27 + 4),1.0 - fVar2);
        *(undefined8 *)this->m_sampleRegister[(int)src_26].blendDstFactorRGB.m_data =
             stack0xfffffffffffffb14;
        this->m_sampleRegister[(int)src_26].blendDstFactorRGB.m_data[2] = local_4e4;
      }
    }
    break;
  case BLENDFUNC_DST_ALPHA:
    for (src_27._0_4_ = 0; (int)src_27 < 0x40; src_27._0_4_ = (int)src_27 + 1) {
      if ((this->m_sampleRegister[(int)src_27].isAlive & 1U) != 0) {
        src1_27 = &this->m_sampleRegister[(int)src_27].clampedBlendSrcColor;
        dst_27 = &this->m_sampleRegister[(int)src_27].clampedBlendSrc1Color;
        local_508 = &this->m_sampleRegister[(int)src_27].clampedBlendDstColor;
        fVar2 = tcu::Vector<float,_4>::w(local_508);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)((long)&src_28 + 4),fVar2);
        *(undefined8 *)this->m_sampleRegister[(int)src_27].blendDstFactorRGB.m_data =
             stack0xfffffffffffffaec;
        this->m_sampleRegister[(int)src_27].blendDstFactorRGB.m_data[2] = local_50c;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_DST_ALPHA:
    for (src_28._0_4_ = 0; (int)src_28 < 0x40; src_28._0_4_ = (int)src_28 + 1) {
      if ((this->m_sampleRegister[(int)src_28].isAlive & 1U) != 0) {
        src1_28 = &this->m_sampleRegister[(int)src_28].clampedBlendSrcColor;
        dst_28 = &this->m_sampleRegister[(int)src_28].clampedBlendSrc1Color;
        local_530 = &this->m_sampleRegister[(int)src_28].clampedBlendDstColor;
        fVar2 = tcu::Vector<float,_4>::w(local_530);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)((long)&src_29 + 4),1.0 - fVar2);
        *(undefined8 *)this->m_sampleRegister[(int)src_28].blendDstFactorRGB.m_data =
             stack0xfffffffffffffac4;
        this->m_sampleRegister[(int)src_28].blendDstFactorRGB.m_data[2] = local_534;
      }
    }
    break;
  case BLENDFUNC_CONSTANT_COLOR:
    for (src_29._0_4_ = 0; (int)src_29 < 0x40; src_29._0_4_ = (int)src_29 + 1) {
      if ((this->m_sampleRegister[(int)src_29].isAlive & 1U) != 0) {
        src1_29 = &this->m_sampleRegister[(int)src_29].clampedBlendSrcColor;
        dst_29 = &this->m_sampleRegister[(int)src_29].clampedBlendSrc1Color;
        local_558 = &this->m_sampleRegister[(int)src_29].clampedBlendDstColor;
        tcu::Vector<float,_4>::swizzle
                  ((Vector<float,_4> *)((long)&src_30 + 4),(int)blendRGBState_local,0,1);
        *(undefined8 *)this->m_sampleRegister[(int)src_29].blendDstFactorRGB.m_data =
             stack0xfffffffffffffa9c;
        this->m_sampleRegister[(int)src_29].blendDstFactorRGB.m_data[2] = local_55c;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_CONSTANT_COLOR:
    for (src_30._0_4_ = 0; (int)src_30 < 0x40; src_30._0_4_ = (int)src_30 + 1) {
      if ((this->m_sampleRegister[(int)src_30].isAlive & 1U) != 0) {
        src1_30 = &this->m_sampleRegister[(int)src_30].clampedBlendSrcColor;
        dst_30 = &this->m_sampleRegister[(int)src_30].clampedBlendSrc1Color;
        local_580 = &this->m_sampleRegister[(int)src_30].clampedBlendDstColor;
        tcu::Vector<float,_3>::Vector(&local_598,1.0);
        tcu::Vector<float,_4>::swizzle
                  ((Vector<float,_4> *)((long)&src_31 + 4),(int)blendRGBState_local,0,1);
        tcu::operator-((tcu *)&local_58c,&local_598,(Vector<float,_3> *)((long)&src_31 + 4));
        *(undefined8 *)this->m_sampleRegister[(int)src_30].blendDstFactorRGB.m_data = local_58c;
        this->m_sampleRegister[(int)src_30].blendDstFactorRGB.m_data[2] = local_584;
      }
    }
    break;
  case BLENDFUNC_CONSTANT_ALPHA:
    for (src_31._0_4_ = 0; (int)src_31 < 0x40; src_31._0_4_ = (int)src_31 + 1) {
      if ((this->m_sampleRegister[(int)src_31].isAlive & 1U) != 0) {
        src1_31 = &this->m_sampleRegister[(int)src_31].clampedBlendSrcColor;
        dst_31 = &this->m_sampleRegister[(int)src_31].clampedBlendSrc1Color;
        local_5c0 = &this->m_sampleRegister[(int)src_31].clampedBlendDstColor;
        fVar2 = tcu::Vector<float,_4>::w((Vector<float,_4> *)blendRGBState_local);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)((long)&src_32 + 4),fVar2);
        *(undefined8 *)this->m_sampleRegister[(int)src_31].blendDstFactorRGB.m_data =
             stack0xfffffffffffffa34;
        this->m_sampleRegister[(int)src_31].blendDstFactorRGB.m_data[2] = local_5c4;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_CONSTANT_ALPHA:
    for (src_32._0_4_ = 0; (int)src_32 < 0x40; src_32._0_4_ = (int)src_32 + 1) {
      if ((this->m_sampleRegister[(int)src_32].isAlive & 1U) != 0) {
        src1_32 = &this->m_sampleRegister[(int)src_32].clampedBlendSrcColor;
        dst_32 = &this->m_sampleRegister[(int)src_32].clampedBlendSrc1Color;
        local_5e8 = &this->m_sampleRegister[(int)src_32].clampedBlendDstColor;
        fVar2 = tcu::Vector<float,_4>::w((Vector<float,_4> *)blendRGBState_local);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)((long)&src_33 + 4),1.0 - fVar2);
        *(undefined8 *)this->m_sampleRegister[(int)src_32].blendDstFactorRGB.m_data =
             stack0xfffffffffffffa0c;
        this->m_sampleRegister[(int)src_32].blendDstFactorRGB.m_data[2] = local_5ec;
      }
    }
    break;
  case BLENDFUNC_SRC_ALPHA_SATURATE:
    for (src_33._0_4_ = 0; (int)src_33 < 0x40; src_33._0_4_ = (int)src_33 + 1) {
      if ((this->m_sampleRegister[(int)src_33].isAlive & 1U) != 0) {
        src1_33 = &this->m_sampleRegister[(int)src_33].clampedBlendSrcColor;
        dst_33 = &this->m_sampleRegister[(int)src_33].clampedBlendSrc1Color;
        local_610 = &this->m_sampleRegister[(int)src_33].clampedBlendDstColor;
        fVar2 = tcu::Vector<float,_4>::w(src1_33);
        fVar1 = tcu::Vector<float,_4>::w(local_610);
        fVar2 = de::min<float>(fVar2,1.0 - fVar1);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)((long)&src_34 + 4),fVar2);
        *(undefined8 *)this->m_sampleRegister[(int)src_33].blendDstFactorRGB.m_data =
             stack0xfffffffffffff9e4;
        this->m_sampleRegister[(int)src_33].blendDstFactorRGB.m_data[2] = local_614;
      }
    }
    break;
  case BLENDFUNC_SRC1_COLOR:
    for (src_34._0_4_ = 0; (int)src_34 < 0x40; src_34._0_4_ = (int)src_34 + 1) {
      if ((this->m_sampleRegister[(int)src_34].isAlive & 1U) != 0) {
        src1_34 = &this->m_sampleRegister[(int)src_34].clampedBlendSrcColor;
        dst_34 = &this->m_sampleRegister[(int)src_34].clampedBlendSrc1Color;
        local_638 = &this->m_sampleRegister[(int)src_34].clampedBlendDstColor;
        tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)((long)&src_35 + 4),(int)dst_34,0,1);
        *(undefined8 *)this->m_sampleRegister[(int)src_34].blendDstFactorRGB.m_data =
             stack0xfffffffffffff9bc;
        this->m_sampleRegister[(int)src_34].blendDstFactorRGB.m_data[2] = local_63c;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_SRC1_COLOR:
    for (src_35._0_4_ = 0; (int)src_35 < 0x40; src_35._0_4_ = (int)src_35 + 1) {
      if ((this->m_sampleRegister[(int)src_35].isAlive & 1U) != 0) {
        src1_35 = &this->m_sampleRegister[(int)src_35].clampedBlendSrcColor;
        dst_35 = &this->m_sampleRegister[(int)src_35].clampedBlendSrc1Color;
        local_660 = &this->m_sampleRegister[(int)src_35].clampedBlendDstColor;
        tcu::Vector<float,_3>::Vector(&local_678,1.0);
        tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)((long)&src_36 + 4),(int)dst_35,0,1);
        tcu::operator-((tcu *)&local_66c,&local_678,(Vector<float,_3> *)((long)&src_36 + 4));
        *(undefined8 *)this->m_sampleRegister[(int)src_35].blendDstFactorRGB.m_data = local_66c;
        this->m_sampleRegister[(int)src_35].blendDstFactorRGB.m_data[2] = local_664;
      }
    }
    break;
  case BLENDFUNC_SRC1_ALPHA:
    for (src_36._0_4_ = 0; (int)src_36 < 0x40; src_36._0_4_ = (int)src_36 + 1) {
      if ((this->m_sampleRegister[(int)src_36].isAlive & 1U) != 0) {
        src1_36 = &this->m_sampleRegister[(int)src_36].clampedBlendSrcColor;
        dst_36 = &this->m_sampleRegister[(int)src_36].clampedBlendSrc1Color;
        local_6a0 = &this->m_sampleRegister[(int)src_36].clampedBlendDstColor;
        fVar2 = tcu::Vector<float,_4>::w(dst_36);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)((long)&src_37 + 4),fVar2);
        *(undefined8 *)this->m_sampleRegister[(int)src_36].blendDstFactorRGB.m_data =
             stack0xfffffffffffff954;
        this->m_sampleRegister[(int)src_36].blendDstFactorRGB.m_data[2] = local_6a4;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_SRC1_ALPHA:
    for (src_37._0_4_ = 0; (int)src_37 < 0x40; src_37._0_4_ = (int)src_37 + 1) {
      if ((this->m_sampleRegister[(int)src_37].isAlive & 1U) != 0) {
        src1_37 = &this->m_sampleRegister[(int)src_37].clampedBlendSrcColor;
        dst_37 = &this->m_sampleRegister[(int)src_37].clampedBlendSrc1Color;
        local_6c8 = &this->m_sampleRegister[(int)src_37].clampedBlendDstColor;
        fVar2 = tcu::Vector<float,_4>::w(dst_37);
        tcu::Vector<float,_3>::Vector(&local_6d4,1.0 - fVar2);
        *(undefined8 *)this->m_sampleRegister[(int)src_37].blendDstFactorRGB.m_data =
             local_6d4.m_data._0_8_;
        this->m_sampleRegister[(int)src_37].blendDstFactorRGB.m_data[2] = local_6d4.m_data[2];
      }
    }
  }
  return;
}

Assistant:

void FragmentProcessor::executeBlendFactorComputeRGB (const Vec4& blendColor, const BlendState& blendRGBState)
{
#define SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, FACTOR_EXPRESSION)																				\
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)																	\
	{																																				\
		if (m_sampleRegister[regSampleNdx].isAlive)																									\
		{																																			\
			const Vec4& src		= m_sampleRegister[regSampleNdx].clampedBlendSrcColor;																\
			const Vec4& src1	= m_sampleRegister[regSampleNdx].clampedBlendSrc1Color;																\
			const Vec4& dst		= m_sampleRegister[regSampleNdx].clampedBlendDstColor;																\
			DE_UNREF(src);																															\
			DE_UNREF(src1);																															\
			DE_UNREF(dst);																															\
																																					\
			m_sampleRegister[regSampleNdx].FACTOR_NAME = (FACTOR_EXPRESSION);																		\
		}																																			\
	}

#define SWITCH_SRC_OR_DST_FACTOR_RGB(FUNC_NAME, FACTOR_NAME)																					\
	switch (blendRGBState.FUNC_NAME)																											\
	{																																			\
		case BLENDFUNC_ZERO:						SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(0.0f))								break;	\
		case BLENDFUNC_ONE:							SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(1.0f))								break;	\
		case BLENDFUNC_SRC_COLOR:					SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, src.swizzle(0,1,2))						break;	\
		case BLENDFUNC_ONE_MINUS_SRC_COLOR:			SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(1.0f) - src.swizzle(0,1,2))			break;	\
		case BLENDFUNC_DST_COLOR:					SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, dst.swizzle(0,1,2))						break;	\
		case BLENDFUNC_ONE_MINUS_DST_COLOR:			SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(1.0f) - dst.swizzle(0,1,2))			break;	\
		case BLENDFUNC_SRC_ALPHA:					SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(src.w()))							break;	\
		case BLENDFUNC_ONE_MINUS_SRC_ALPHA:			SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(1.0f - src.w()))						break;	\
		case BLENDFUNC_DST_ALPHA:					SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(dst.w()))							break;	\
		case BLENDFUNC_ONE_MINUS_DST_ALPHA:			SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(1.0f - dst.w()))						break;	\
		case BLENDFUNC_CONSTANT_COLOR:				SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, blendColor.swizzle(0,1,2))				break;	\
		case BLENDFUNC_ONE_MINUS_CONSTANT_COLOR:	SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(1.0f) - blendColor.swizzle(0,1,2))	break;	\
		case BLENDFUNC_CONSTANT_ALPHA:				SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(blendColor.w()))						break;	\
		case BLENDFUNC_ONE_MINUS_CONSTANT_ALPHA:	SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(1.0f - blendColor.w()))				break;	\
		case BLENDFUNC_SRC_ALPHA_SATURATE:			SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(de::min(src.w(), 1.0f - dst.w())))	break;	\
		case BLENDFUNC_SRC1_COLOR:					SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, src1.swizzle(0,1,2))						break;	\
		case BLENDFUNC_ONE_MINUS_SRC1_COLOR:		SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(1.0f) - src1.swizzle(0,1,2))			break;	\
		case BLENDFUNC_SRC1_ALPHA:					SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(src1.w()))							break;	\
		case BLENDFUNC_ONE_MINUS_SRC1_ALPHA:		SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(1.0f - src1.w()))					break;	\
		default:																																\
			DE_ASSERT(false);																													\
	}

	SWITCH_SRC_OR_DST_FACTOR_RGB(srcFunc, blendSrcFactorRGB)
	SWITCH_SRC_OR_DST_FACTOR_RGB(dstFunc, blendDstFactorRGB)

#undef SWITCH_SRC_OR_DST_FACTOR_RGB
#undef SAMPLE_REGISTER_BLEND_FACTOR
}